

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O1

void __thiscall kratos::Simulator::process_stmt(Simulator *this,StmtBlock *block,Var *var)

{
  pointer psVar1;
  shared_ptr<kratos::Stmt> *stmt;
  pointer psVar2;
  
  psVar1 = (block->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (block->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    process_stmt(this,(psVar2->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 var);
  }
  return;
}

Assistant:

void Simulator::process_stmt(kratos::StmtBlock *block, const Var *var) {
    for (auto &stmt : *block) {
        process_stmt(stmt.get(), var);
    }
}